

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit.hpp
# Opt level: O2

void __thiscall
cppjit::kernel<bool,_cppjit::detail::pack<int>_>::set_builder
          (kernel<bool,_cppjit::detail::pack<int>_> *this,
          shared_ptr<cppjit::builder::builder> *builder_)

{
  builder *this_00;
  cppjit_exception *this_01;
  allocator local_39;
  string local_38;
  
  this_00 = (this->builder).super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00 != (builder *)0x0) {
    builder::builder::clear(this_00);
    std::__shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->builder).
                super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>,
               &builder_->super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>);
    return;
  }
  this_01 = (cppjit_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"builder is invalid",&local_39);
  cppjit_exception::cppjit_exception(this_01,&local_38);
  __cxa_throw(this_01,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
}

Assistant:

void set_builder(std::shared_ptr<cppjit::builder::builder> builder_) {
    if (!builder) {
      throw cppjit::cppjit_exception("builder is invalid");
    }
    builder->clear();
    builder = builder_;
  }